

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

int __thiscall
gl4cts::TextureParameterQueriesTestCase::init
          (TextureParameterQueriesTestCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  ContextInfo *this_00;
  value_type_conflict1 local_40 [12];
  TextureParameterQueriesTestCase *local_10;
  TextureParameterQueriesTestCase *this_local;
  
  local_40[0xb] = 0xde1;
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_40 + 0xb);
  local_40[10] = 0x8c1a;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_40 + 10);
  local_40[9] = 0x8513;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_40 + 9);
  local_40[8] = 0x9009;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_40 + 8);
  local_40[7] = 0x806f;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_40 + 7);
  local_40[6] = 0x84f5;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mSupportedTargets,local_40 + 6);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_texture2");
  if (bVar1) {
    local_40[1] = 0xde0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mNotSupportedTargets,local_40 + 1);
    local_40[0] = 0x8c18;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mNotSupportedTargets,local_40);
    iVar2 = extraout_EAX_00;
  }
  else {
    local_40[5] = 0xde0;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mNotSupportedTargets,local_40 + 5);
    local_40[4] = 0x8c18;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mNotSupportedTargets,local_40 + 4);
    local_40[3] = 0x9100;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mNotSupportedTargets,local_40 + 3);
    local_40[2] = 0x9102;
    std::vector<int,_std::allocator<int>_>::push_back(&this->mNotSupportedTargets,local_40 + 2);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void TextureParameterQueriesTestCase::init()
{
	mSupportedTargets.push_back(GL_TEXTURE_2D);
	mSupportedTargets.push_back(GL_TEXTURE_2D_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP);
	mSupportedTargets.push_back(GL_TEXTURE_CUBE_MAP_ARRAY);
	mSupportedTargets.push_back(GL_TEXTURE_3D);
	mSupportedTargets.push_back(GL_TEXTURE_RECTANGLE);

	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		mNotSupportedTargets.push_back(GL_TEXTURE_1D);
		mNotSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
		mNotSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE);
		mNotSupportedTargets.push_back(GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
	}
	else
	{
		mNotSupportedTargets.push_back(GL_TEXTURE_1D);
		mNotSupportedTargets.push_back(GL_TEXTURE_1D_ARRAY);
	}
}